

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

void waitkey(void)

{
  int iVar1;
  
  if (debuginfo != '\0') {
    iVar1 = getchar();
    if (iVar1 < 0x73) {
      if (iVar1 == 0x69) {
        irq();
        return;
      }
      if (iVar1 == 0x72) {
        debuginfo = '\0';
      }
    }
    else {
      if (iVar1 == 0x73) {
        show_screen();
        return;
      }
      if (iVar1 == 0x78) {
        (*decode[0xff])();
        return;
      }
    }
  }
  return;
}

Assistant:

void waitkey(void) {
    int c;
    if (debuginfo)             // Check if debugging is enabled
    {
        c = getchar();
        switch (c) {
            case 'i':
                irq();
                break;           // if "I" is pressed, generated an IRQ
            case 'r':
                debuginfo = 0;
                break;      // turn off debugging and run freely
            case 's':
                show_screen();
                break;   // if "s", display a mode 7 screen
            case 'x':
                decode[0xFF]();
                break;  // if "x", exit!
        }
    }
}